

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O1

pair<const_llvm::ConstantInt_*,_dg::vr::Relations>
dg::vr::RelationsAnalyzer::getBoundOnPointedToValue
          (vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
           *changeLocations,VectorSet<const_llvm::Value_*> *froms,Relation rel)

{
  pointer ppVVar1;
  VRLocation *pVVar2;
  pointer prVar3;
  _Base_bitset<1UL> _Var4;
  bool bVar5;
  Type rel_00;
  uint uVar6;
  HandlePtr mVal;
  HandlePtr pBVar7;
  C rt;
  ulong *puVar8;
  _Base_bitset<1UL> _Var9;
  C lt;
  pointer ppVVar10;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> pVar11;
  bitset<12UL> local_48;
  
  ppVVar10 = (changeLocations->
             super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppVVar1 = (changeLocations->
            super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVVar10 == ppVVar1) {
    _Var9._M_w = 0xfff;
LAB_0011f8b8:
    lt = (C)0x0;
  }
  else {
    _Var9._M_w = 0xfff;
    lt = (C)0x0;
    do {
      pVVar2 = *ppVVar10;
      pBVar7 = getCorrespondingByContent(&pVVar2->relations,froms);
      prVar3 = (pBVar7->relatedBuckets)._M_elems[10].vec.
               super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (prVar3 == (pBVar7->relatedBuckets)._M_elems[10].vec.
                    super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0011f8b8;
      pVar11 = ValueRelations::getBound<dg::vr::Bucket>(&pVVar2->relations,prVar3->_M_data,rel);
      rt = pVar11.first;
      _Var4._M_w = _Var9._M_w;
      if (rt != (C)0x0) {
        if (lt == (C)0x0) {
LAB_0011f85c:
          uVar6 = dg::vr::Relations::getStrict(rel);
          if (0xb < uVar6) {
            std::__throw_out_of_range_fmt
                      ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",
                       (ulong)uVar6,0xc);
          }
          puVar8 = (ulong *)dg::vr::Relations::addImplied();
          _Var9._M_w = *puVar8;
          lt = rt;
        }
        else {
          rel_00 = dg::vr::Relations::getStrict(rel);
          bVar5 = ValueRelations::compare(lt,rel_00,rt);
          if (bVar5) goto LAB_0011f85c;
        }
        _Var9._M_w = _Var9._M_w & (ulong)pVar11.second.bits.super__Base_bitset<1UL>._M_w.bits;
        _Var4 = local_48.super__Base_bitset<1UL>._M_w;
      }
      local_48.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)_Var4._M_w;
      if (rt == (C)0x0) {
        lt = (C)0x0;
        _Var9._M_w = (_WordT)local_48.super__Base_bitset<1UL>._M_w;
        break;
      }
      ppVVar10 = ppVVar10 + 1;
    } while (ppVVar10 != ppVVar1);
  }
  pVar11.second.bits.super__Base_bitset<1UL>._M_w = (bitset<12UL>)(bitset<12UL>)_Var9._M_w;
  pVar11.first = lt;
  return pVar11;
}

Assistant:

std::pair<RelationsAnalyzer::C, Relations>
RelationsAnalyzer::getBoundOnPointedToValue(
        const std::vector<const VRLocation *> &changeLocations,
        const VectorSet<V> &froms, Relation rel) {
    C bound = nullptr;
    Relations current = allRelations;

    for (const VRLocation *loc : changeLocations) {
        const ValueRelations &graph = loc->relations;
        HandlePtr from = getCorrespondingByContent(graph, froms);
        assert(from);
        if (!graph.hasLoad(*from))
            return {nullptr, current};

        Handle pointedTo = graph.getPointedTo(*from);
        auto valueRels = graph.getBound(pointedTo, rel);

        if (!valueRels.first)
            return {nullptr, current};

        if (!bound || ValueRelations::compare(bound, Relations::getStrict(rel),
                                              valueRels.first)) {
            bound = valueRels.first;
            current = Relations().set(Relations::getStrict(rel)).addImplied();
        }

        current &= valueRels.second;
        assert(current.any());
    }
    return {bound, current};
}